

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_file.hpp
# Opt level: O2

void __thiscall iutest::TempFile::TempFile(TempFile *this)

{
  (this->super_IFile).super_IOutStream._vptr_IOutStream = (_func_int **)&PTR__TempFile_0012f928;
  (this->super_IFile).super_IInStream._vptr_IInStream = (_func_int **)&PTR__TempFile_0012f978;
  (this->m_file).super_IFile.super_IOutStream._vptr_IOutStream =
       (_func_int **)&PTR__StdioFile_0012fa20;
  (this->m_file).super_IFile.super_IInStream._vptr_IInStream =
       (_func_int **)&PTR__StdioFile_0012fa70;
  (this->m_file).m_fp = (FILE *)0x0;
  this->m_fd = -1;
  (this->m_filename)._M_dataplus._M_p = (pointer)&(this->m_filename).field_2;
  (this->m_filename)._M_string_length = 0;
  (this->m_filename).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

TempFile() IUTEST_CXX_NOEXCEPT_SPEC
        : m_fd(-1)
    {
    }